

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O3

FieldDescriptorProto * __thiscall
google::protobuf::DescriptorProto::add_field(DescriptorProto *this)

{
  int iVar1;
  void **ppvVar2;
  FieldDescriptorProto *pFVar3;
  int iVar4;
  
  iVar1 = (this->field_).super_RepeatedPtrFieldBase.current_size_;
  iVar4 = (this->field_).super_RepeatedPtrFieldBase.allocated_size_;
  if (iVar1 < iVar4) {
    ppvVar2 = (this->field_).super_RepeatedPtrFieldBase.elements_;
    (this->field_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pFVar3 = (FieldDescriptorProto *)ppvVar2[iVar1];
  }
  else {
    if (iVar4 == (this->field_).super_RepeatedPtrFieldBase.total_size_) {
      internal::RepeatedPtrFieldBase::Reserve(&(this->field_).super_RepeatedPtrFieldBase,iVar4 + 1);
      iVar4 = (this->field_).super_RepeatedPtrFieldBase.allocated_size_;
    }
    (this->field_).super_RepeatedPtrFieldBase.allocated_size_ = iVar4 + 1;
    pFVar3 = internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>::New();
    ppvVar2 = (this->field_).super_RepeatedPtrFieldBase.elements_;
    iVar1 = (this->field_).super_RepeatedPtrFieldBase.current_size_;
    (this->field_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    ppvVar2[iVar1] = pFVar3;
  }
  return pFVar3;
}

Assistant:

inline ::google::protobuf::FieldDescriptorProto* DescriptorProto::add_field() {
  return field_.Add();
}